

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s98c_action.c
# Opt level: O1

void s98c_write_sync_n(s98c *ctx,uint32_t num)

{
  int iVar1;
  uint8_t n;
  uint uVar2;
  bool bVar3;
  
  if (num == 1) {
    n = 0xff;
  }
  else {
    iVar1 = (ctx->header).version;
    s98c_write(ctx,0xfe);
    if (iVar1 != 1) {
      uVar2 = num - 2;
      do {
        s98c_write(ctx,(0x7f < uVar2) << 7 | (byte)uVar2 & 0x7f);
        bVar3 = 0x7f < uVar2;
        uVar2 = uVar2 >> 7;
      } while (bVar3);
      return;
    }
    n = (char)num + 0xfe;
  }
  s98c_write(ctx,n);
  return;
}

Assistant:

void s98c_write_sync_n(struct s98c* ctx, uint32_t num)
{
    if(num == 1) {
        s98c_write(ctx, 0xff);
    } else if(ctx->header.version != 1) {
        uint8_t v;

        s98c_write(ctx, 0xfe);
        num -= 2;
        do {
            v = (num & 0x7f);
            num >>= 7;
            if(num != 0) {
                v |= 0x80;
            }
            s98c_write(ctx, v);
        } while(num);
    } else {
        num -= 2;
        s98c_write(ctx, 0xfe);
        s98c_write(ctx, num & 0xff);
    }
}